

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *
QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_>::allocateGrow
          (QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *__return_storage_ptr__,
          QArrayDataPointer<std::pair<QTableWidgetItem_*,_int>_> *from,qsizetype n,
          GrowthPosition position)

{
  long lVar1;
  pair<QTableWidgetItem_*,_int> *ppVar2;
  long lVar3;
  long lVar4;
  Data *pDVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = from->d;
  if (pDVar5 == (Data *)0x0) {
    lVar1 = 0;
    lVar4 = from->size;
    if (from->size < 1) {
      lVar4 = lVar1;
    }
    lVar4 = lVar4 + n;
  }
  else {
    lVar1 = (pDVar5->super_QArrayData).alloc;
    lVar4 = from->size;
    lVar7 = lVar1;
    if (lVar1 < lVar4) {
      lVar7 = lVar4;
    }
    lVar3 = (long)((long)from->ptr -
                  ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4
    ;
    lVar8 = lVar1 - (lVar4 + lVar3);
    if (position != GrowsAtEnd) {
      lVar8 = lVar3;
    }
    lVar8 = (lVar7 + n) - lVar8;
    lVar4 = lVar8;
    if (lVar8 < lVar1) {
      lVar4 = lVar1;
    }
    if (((pDVar5->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
      lVar4 = lVar8;
    }
  }
  local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  ppVar2 = (pair<QTableWidgetItem_*,_int> *)
           QArrayData::allocate(&local_38,0x10,0x10,lVar4,(uint)(lVar4 <= lVar1));
  if (ppVar2 == (pair<QTableWidgetItem_*,_int> *)0x0 || local_38 == (QArrayData *)0x0)
  goto LAB_005997fb;
  if (position == GrowsAtBeginning) {
    uVar9 = (local_38->alloc - (from->size + n)) / 2;
    uVar6 = 0;
    if ((long)uVar9 < 1) {
      uVar9 = uVar6;
    }
    pDVar5 = from->d;
    ppVar2 = ppVar2 + uVar9 + n;
    if (pDVar5 != (Data *)0x0) {
LAB_005997f1:
      uVar6 = (ulong)(pDVar5->super_QArrayData).flags.
                     super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
                     super_QFlagsStorage<QArrayData::ArrayOption>.i;
    }
  }
  else {
    pDVar5 = from->d;
    if (pDVar5 != (Data *)0x0) {
      ppVar2 = (pair<QTableWidgetItem_*,_int> *)
               ((long)ppVar2 +
               ((long)from->ptr -
               ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)));
      goto LAB_005997f1;
    }
    uVar6 = 0;
  }
  (local_38->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
  super_QFlagsStorage<QArrayData::ArrayOption>.i = (Int)uVar6;
LAB_005997fb:
  __return_storage_ptr__->d = (Data *)local_38;
  __return_storage_ptr__->ptr = ppVar2;
  __return_storage_ptr__->size = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static QArrayDataPointer allocateGrow(const QArrayDataPointer &from, qsizetype n, QArrayData::GrowthPosition position)
    {
        // calculate new capacity. We keep the free capacity at the side that does not have to grow
        // to avoid quadratic behavior with mixed append/prepend cases

        // use qMax below, because constAllocatedCapacity() can be 0 when using fromRawData()
        qsizetype minimalCapacity = qMax(from.size, from.constAllocatedCapacity()) + n;
        // subtract the free space at the side we want to allocate. This ensures that the total size requested is
        // the existing allocation at the other side + size + n.
        minimalCapacity -= (position == QArrayData::GrowsAtEnd) ? from.freeSpaceAtEnd() : from.freeSpaceAtBegin();
        qsizetype capacity = from.detachCapacity(minimalCapacity);
        const bool grows = capacity > from.constAllocatedCapacity();
        auto [header, dataPtr] = Data::allocate(capacity, grows ? QArrayData::Grow : QArrayData::KeepSize);
        const bool valid = header != nullptr && dataPtr != nullptr;
        if (!valid)
            return QArrayDataPointer(header, dataPtr);

        // Idea: * when growing backwards, adjust pointer to prepare free space at the beginning
        //       * when growing forward, adjust by the previous data pointer offset
        dataPtr += (position == QArrayData::GrowsAtBeginning)
                ? n + qMax(0, (header->alloc - from.size - n) / 2)
                : from.freeSpaceAtBegin();
        header->flags = from.flags();
        return QArrayDataPointer(header, dataPtr);
    }